

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

int __thiscall Frame::remove(Frame *this,char *__filename)

{
  uchar *puVar1;
  
  puVar1 = (this->m_Data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + this->m_Size;
  if (__filename + (long)this->m_Pos <= puVar1) {
    puVar1 = (uchar *)(__filename + (long)this->m_Pos);
  }
  this->m_Pos = puVar1;
  return (int)this;
}

Assistant:

Frame& Frame::remove(size_t numBytes)
{
    m_Pos = std::min<uint8_t*>(m_Pos + numBytes, m_Data.get() + m_Size);
    return *this;
}